

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

void __thiscall ON_OBSOLETE_V5_Annotation::Destroy(ON_OBSOLETE_V5_Annotation *this)

{
  ON_2dPoint *__s;
  long lVar1;
  ON_Plane *pOVar2;
  ON_Plane *pOVar3;
  byte bVar4;
  
  bVar4 = 0;
  this->m_v5_3dm_archive_dimstyle_index = -1;
  __s = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a;
  if (__s != (ON_2dPoint *)0x0) {
    memset(__s,0,(long)(this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_capacity << 4);
  }
  (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
  ON_OBSOLETE_V5_AnnotationText::SetText(&this->m_usertext,(wchar_t *)0x0);
  ON_AnnotationTextFormula::Set(this,(wchar_t *)0x0);
  this->m_type = dtNothing;
  pOVar2 = &ON_xy_plane;
  pOVar3 = &this->m_plane;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pOVar3->origin).x = (pOVar2->origin).x;
    pOVar2 = (ON_Plane *)((long)pOVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    pOVar3 = (ON_Plane *)((long)pOVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  this->m_userpositionedtext = false;
  this->m_annotative_scale = true;
  this->m_justification = 0;
  return;
}

Assistant:

void ON_OBSOLETE_V5_Annotation::Destroy()
{
  m_v5_3dm_archive_dimstyle_index = -1;

  // 10-27-03 LW memory leak prevention
  m_points.Empty();
  SetTextValue(0);
  SetTextFormula(0);
  m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing;
  m_plane = ON_xy_plane;
  m_userpositionedtext = false;
  m_justification = 0;
  m_annotative_scale = true;
}